

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O1

void anon_unknown.dwarf_32b84a::wheel(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  float fVar5;
  ushort uVar6;
  float fVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  float __y;
  float fVar12;
  float fVar13;
  ulong local_80;
  
  if (0 < h) {
    fVar2 = (float)w * 0.5;
    fVar3 = (float)h * 0.5;
    fVar5 = fVar2;
    if (fVar3 <= fVar2) {
      fVar5 = fVar3;
    }
    lVar10 = 0;
    local_80 = 0;
    do {
      if (0 < w) {
        __y = (float)(int)local_80 - fVar3;
        uVar9 = 0;
        do {
          lVar11 = pixels->_sizeY;
          pRVar1 = pixels->_data;
          fVar13 = (float)(int)uVar9 - fVar2;
          fVar12 = fVar13 * fVar13 + __y * __y;
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          lVar11 = lVar11 * lVar10;
          if ((fVar5 < fVar12) || (fVar12 < 25.46479)) {
            *(undefined8 *)((long)&pRVar1[uVar9].r._h + lVar11) = 0x3800380038003800;
          }
          else {
            fVar13 = atan2f(__y,fVar13);
            fVar12 = sinf(fVar13 * 40.0 + fVar12 * 0.5);
            fVar12 = fVar12 * 0.5 + 0.5;
            fVar13 = fVar12 * 0.5 + 0.5;
            fVar7 = ABS(fVar13);
            uVar6 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
            if ((uint)fVar7 < 0x38800000) {
              if ((0x33000000 < (uint)fVar7) &&
                 (uVar8 = (uint)fVar7 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar7 >> 0x17),
                 uVar6 = uVar6 | (ushort)(uVar8 >> (0x7eU - cVar4 & 0x1f)),
                 0x80000000 < uVar8 << (cVar4 + 0xa2U & 0x1f))) {
                uVar6 = uVar6 + 1;
              }
            }
            else if ((uint)fVar7 < 0x7f800000) {
              if ((uint)fVar7 < 0x477ff000) {
                uVar6 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >>
                                0xd) | uVar6;
              }
              else {
                uVar6 = uVar6 | 0x7c00;
              }
            }
            else {
              uVar6 = uVar6 | 0x7c00;
              if (fVar7 != INFINITY) {
                uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
                uVar6 = uVar6 | (ushort)uVar8 | (ushort)(uVar8 == 0);
              }
            }
            *(ushort *)((long)&pRVar1[uVar9].r._h + lVar11) = uVar6;
            *(ushort *)((long)&pRVar1[uVar9].g._h + lVar11) = uVar6;
            *(ushort *)((long)&pRVar1[uVar9].b._h + lVar11) = uVar6;
            fVar12 = fVar12 * -0.5 + 0.5;
            fVar13 = ABS(fVar12);
            uVar6 = (ushort)((uint)fVar12 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar8 = (uint)fVar13 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar13 >> 0x17),
                 uVar6 = uVar6 | (ushort)(uVar8 >> (0x7eU - cVar4 & 0x1f)),
                 0x80000000 < uVar8 << (cVar4 + 0xa2U & 0x1f))) {
                uVar6 = uVar6 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar6 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar6;
              }
              else {
                uVar6 = uVar6 | 0x7c00;
              }
            }
            else {
              uVar6 = uVar6 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar8 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar6 = uVar6 | (ushort)uVar8 | (ushort)(uVar8 == 0);
              }
            }
            *(ushort *)((long)&pRVar1[uVar9].a._h + lVar11) = uVar6;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)w != uVar9);
      }
      local_80 = local_80 + 1;
      lVar10 = lVar10 + 8;
    } while (local_80 != (uint)h);
  }
  return;
}

Assistant:

void
wheel (Array2D<Rgba>& pixels, int w, int h)
{
    float n      = 40;
    float m      = 0.5;
    float radMin = 2 * n / M_PI;
    float xCen   = w * 0.5;
    float yCen   = h * 0.5;
    float radMax = (xCen < yCen) ? xCen : yCen;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];
            float rad =
                sqrt ((x - xCen) * (x - xCen) + (y - yCen) * (y - yCen));

            if (rad <= radMax && rad >= radMin)
            {
                float phi = atan2 (y - yCen, x - xCen);
                float c   = 0.5 + 0.5 * sin (phi * n + rad * m);

                p.r = 0.5 + 0.5 * c;
                p.g = p.r;
                p.b = p.r;
                p.a = 0.5 - 0.5 * c;
            }
            else
            {
                p.r = 0.5;
                p.g = p.r;
                p.b = p.r;
                p.a = p.r;
            }
        }
    }
}